

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::default_call_policies,boost::mpl::vector5<void,AbstractModuleClient&,std::__cxx11::string,std::__cxx11::string,TrodesMsg&>,mpl_::int_<0>>
                 (object_base param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,
                 undefined8 param_5,pair *param_6)

{
  caller<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
  *in_stack_ffffffffffffff78;
  py_function *in_stack_ffffffffffffff80;
  caller<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
  local_60;
  py_function local_50;
  pair *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_18;
  undefined8 local_10;
  PyObject *local_8;
  
  local_48 = param_6;
  local_40 = param_5;
  local_38 = param_4;
  local_30 = param_2;
  local_28 = param_3;
  local_18 = param_2;
  local_10 = param_3;
  local_8 = param_1.m_ptr;
  caller<void_(AbstractModuleClient::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TrodesMsg_&>_>
  ::caller(&local_60,param_2,param_3);
  objects::py_function::
  py_function<boost::python::detail::caller<void(AbstractModuleClient::*)(std::__cxx11::string,std::__cxx11::string,TrodesMsg&),boost::python::default_call_policies,boost::mpl::vector5<void,AbstractModuleClient&,std::__cxx11::string,std::__cxx11::string,TrodesMsg&>>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  objects::function_object((objects *)param_1.m_ptr,&local_50,local_48);
  objects::py_function::~py_function((py_function *)0x3f031b);
  return (object)(object_base)param_1.m_ptr;
}

Assistant:

object make_function_aux(
      F f
      , CallPolicies const& p
      , Sig const&
      , detail::keyword_range const& kw // a [begin,end) pair of iterators over keyword names
      , NumKeywords                     // An MPL integral type wrapper: the size of kw
      )
  {
      enum { arity = mpl::size<Sig>::value - 1 };
      
      typedef typename detail::error::more_keywords_than_function_arguments<
          NumKeywords::value, arity
          >::too_many_keywords assertion BOOST_ATTRIBUTE_UNUSED;
    
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
        , kw);
  }